

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool __thiscall crnd::crn_unpacker::decode_alpha_endpoints(crn_unpacker *this)

{
  symbol_codec *this_00;
  byte bVar1;
  byte bVar2;
  crn_header *pcVar3;
  unsigned_short *puVar4;
  bool bVar5;
  bool bVar6;
  uint32 uVar7;
  uint uVar8;
  uint8 *puVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  static_huffman_data_model dm;
  uint local_68;
  static_huffman_data_model local_58;
  
  pcVar3 = this->m_pHeader;
  uVar10 = (uint)(pcVar3->m_alpha_endpoints).m_size.m_buf[2] |
           (uint)(pcVar3->m_alpha_endpoints).m_size.m_buf[1] << 8 |
           (uint)(pcVar3->m_alpha_endpoints).m_size.m_buf[0] << 0x10;
  if (uVar10 == 0) {
    bVar5 = false;
  }
  else {
    bVar1 = (pcVar3->m_alpha_endpoints).m_num.m_buf[0];
    bVar2 = (pcVar3->m_alpha_endpoints).m_num.m_buf[1];
    puVar9 = this->m_pData +
             ((ulong)(pcVar3->m_alpha_endpoints).m_ofs.m_buf[2] |
             (ulong)((uint)(pcVar3->m_alpha_endpoints).m_ofs.m_buf[0] << 0x10 |
                    (uint)(pcVar3->m_alpha_endpoints).m_ofs.m_buf[1] << 8));
    (this->m_codec).m_pDecode_buf = puVar9;
    (this->m_codec).m_pDecode_buf_next = puVar9;
    (this->m_codec).m_decode_buf_size = uVar10;
    (this->m_codec).m_pDecode_buf_end = puVar9 + uVar10;
    (this->m_codec).m_bit_buf = 0;
    (this->m_codec).m_bit_count = 0;
    local_58.m_total_syms = 0;
    this_00 = &this->m_codec;
    local_58.m_code_sizes.m_p = (uchar *)0x0;
    local_58.m_code_sizes.m_size = 0;
    local_58.m_code_sizes.m_capacity = 0;
    local_58.m_code_sizes.m_alloc_failed = false;
    local_58.m_pDecode_tables = (decoder_tables *)0x0;
    bVar5 = symbol_codec::decode_receive_static_data_model(this_00,&local_58);
    if (bVar5) {
      bVar6 = vector<unsigned_short>::resize
                        (&this->m_alpha_endpoints,(uint)bVar1 * 0x100 + (uint)bVar2);
      uVar10 = 0;
      bVar5 = false;
      if (bVar6) {
        puVar4 = (this->m_alpha_endpoints).m_p;
        uVar11 = 0;
        for (lVar12 = 0; local_68 = (uint)CONCAT11(bVar1,bVar2), local_68 != (uint)lVar12;
            lVar12 = lVar12 + 1) {
          uVar7 = symbol_codec::decode(this_00,&local_58);
          uVar10 = uVar10 + uVar7 & 0xff;
          uVar7 = symbol_codec::decode(this_00,&local_58);
          uVar8 = uVar7 + uVar11;
          uVar11 = uVar8 & 0xff;
          puVar4[lVar12] = (short)uVar8 * 0x100 | (ushort)uVar10;
        }
        bVar5 = true;
      }
    }
    else {
      bVar5 = false;
    }
    static_huffman_data_model::~static_huffman_data_model(&local_58);
  }
  return bVar5;
}

Assistant:

bool decode_alpha_endpoints() {
    const uint32 num_alpha_endpoints = m_pHeader->m_alpha_endpoints.m_num;

    if (!m_codec.start_decoding(m_pData + m_pHeader->m_alpha_endpoints.m_ofs, m_pHeader->m_alpha_endpoints.m_size))
      return false;

    static_huffman_data_model dm;
    if (!m_codec.decode_receive_static_data_model(dm))
      return false;

    if (!m_alpha_endpoints.resize(num_alpha_endpoints))
      return false;

    uint16* CRND_RESTRICT pDst = &m_alpha_endpoints[0];
    uint32 a = 0, b = 0;

    for (uint32 i = 0; i < num_alpha_endpoints; i++) {
      a = (a + m_codec.decode(dm)) & 255;
      b = (b + m_codec.decode(dm)) & 255;
      *pDst++ = (uint16)(a | (b << 8));
    }

    m_codec.stop_decoding();

    return true;
  }